

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.h
# Opt level: O0

void __thiscall Heuristics::Heuristics(Heuristics *this)

{
  Cell local_25;
  Cell local_24;
  Cell local_23;
  Cell local_22;
  Cell local_21;
  Cell local_20;
  Cell local_1f;
  Cell local_1e;
  Cell local_1d [13];
  Heuristics *local_10;
  Heuristics *this_local;
  
  local_10 = this;
  std::vector<Table,_std::allocator<Table>_>::vector(&this->visited);
  std::stack<Table,std::deque<Table,std::allocator<Table>>>::
  stack<std::deque<Table,std::allocator<Table>>,void>
            ((stack<Table,std::deque<Table,std::allocator<Table>>> *)&this->frontier);
  std::queue<Table,std::deque<Table,std::allocator<Table>>>::
  queue<std::deque<Table,std::allocator<Table>>,void>
            ((queue<Table,std::deque<Table,std::allocator<Table>>> *)&this->frontierQ);
  std::vector<Table,_std::allocator<Table>_>::vector(&this->evaluatedChildren);
  Table::Table(&this->targetState);
  Cell::Cell(local_1d,'1');
  (this->targetState).table[0][0].number = local_1d[0].number;
  Cell::Cell(&local_1e,'2');
  (this->targetState).table[0][1].number = local_1e.number;
  Cell::Cell(&local_1f,'3');
  (this->targetState).table[0][2].number = local_1f.number;
  Cell::Cell(&local_20,'4');
  (this->targetState).table[1][0].number = local_20.number;
  Cell::Cell(&local_21,'5');
  (this->targetState).table[1][1].number = local_21.number;
  Cell::Cell(&local_22,'6');
  (this->targetState).table[1][2].number = local_22.number;
  Cell::Cell(&local_23,'7');
  (this->targetState).table[2][0].number = local_23.number;
  Cell::Cell(&local_24,'8');
  (this->targetState).table[2][1].number = local_24.number;
  Cell::Cell(&local_25,' ');
  (this->targetState).table[2][2].number = local_25.number;
  return;
}

Assistant:

Heuristics(){
        targetState.table[0][0] = Cell('1');
        targetState.table[0][1] = Cell('2');
        targetState.table[0][2] = Cell('3');
        targetState.table[1][0] = Cell('4');
        targetState.table[1][1] = Cell('5');
        targetState.table[1][2] = Cell('6');
        targetState.table[2][0] = Cell('7');
        targetState.table[2][1] = Cell('8');
        targetState.table[2][2] = Cell(' ');
    }